

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cBufferStorageTests.cpp
# Opt level: O1

IterateResult __thiscall
gl4cts::BufferStorage::MapPersistentDrawTest::iterate(MapPersistentDrawTest *this)

{
  ostringstream *poVar1;
  TestLog *pTVar2;
  _Alloc_hider _Var3;
  bool bVar4;
  int iVar5;
  GLenum GVar6;
  ContextType ctxType;
  deUint32 dVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ConstPixelBufferAccess *pCVar8;
  void *__buf;
  void *__buf_00;
  qpTestResult testResult;
  char *pcVar9;
  bool bVar10;
  MoveMapOwner MVar11;
  MoveMapOwner MVar12;
  Buffer rectangles;
  MapOwner atom_map;
  MapOwner rectangles_map;
  Framebuffer framebuffer;
  Buffer atom;
  Texture texture;
  ConstPixelBufferAccess img;
  VertexArray vao;
  Program program;
  GLint clear_color [4];
  GLubyte texture_data [1024];
  string local_740;
  string local_720;
  Buffer local_700;
  string local_6e8;
  string local_6c8;
  Framebuffer local_6a8;
  Buffer local_698;
  Texture local_680;
  undefined1 local_670 [40];
  VertexArray local_648;
  Program local_638;
  undefined1 local_5c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5b8;
  _Alloc_hider local_5a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_598 [4];
  ios_base local_550 [264];
  GLint local_448 [4];
  undefined1 local_438 [540];
  int local_21c;
  Functions *gl;
  
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar5);
  local_700.m_context = (this->super_TestCase).m_context;
  local_698.m_id = 0xffffffff;
  local_698.m_target = 0x8892;
  local_700.m_id = 0xffffffff;
  local_700.m_target = 0x8892;
  local_698.m_context = local_700.m_context;
  BufferStorage::Buffer::InitStorage(&local_698,0x92c0,0x43,4,(GLvoid *)0x0);
  BufferStorage::Buffer::InitStorage(&local_700,0x8a11,0x42,0x20,(GLvoid *)0x0);
  local_6a8.m_context = (this->super_TestCase).m_context;
  local_6a8.m_id = 0xffffffff;
  local_680.m_id = 0xffffffff;
  local_680.m_context = local_6a8.m_context;
  BufferStorage::Texture::Generate(gl,&local_680.m_id);
  (*gl->bindTexture)(0xde1,local_680.m_id);
  GVar6 = (*gl->getError)();
  glu::checkError(GVar6,"BindTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                  ,0x52a);
  (*gl->texStorage2D)(0xde1,1,0x8058,0x10,0x10);
  GVar6 = (*gl->getError)();
  glu::checkError(GVar6,"TexStorage2D",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                  ,0x5e4);
  BufferStorage::Framebuffer::Generate(gl,&local_6a8.m_id);
  (*gl->bindFramebuffer)(0x8ca9,local_6a8.m_id);
  GVar6 = (*gl->getError)();
  glu::checkError(GVar6,"BindFramebuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                  ,0x3a0);
  BufferStorage::Framebuffer::AttachTexture(gl,0x8ca9,0x8ce0,local_680.m_id,0x10,0x10);
  local_648.m_context = (this->super_TestCase).m_context;
  local_648.m_id = 0xffffffff;
  VertexArray::Generate(gl,&local_648.m_id);
  (*gl->bindVertexArray)(local_648.m_id);
  GVar6 = (*gl->getError)();
  glu::checkError(GVar6,"BindVertexArray",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                  ,0x650);
  local_638.m_compute.m_context = (this->super_TestCase).m_context;
  local_638.m_id = 0;
  local_638.m_compute.m_id = 0;
  local_638.m_fragment.m_id = 0;
  local_638.m_geometry.m_id = 0;
  local_638.m_tess_ctrl.m_id = 0;
  local_638.m_tess_eval.m_id = 0;
  local_638.m_vertex.m_id = 0;
  local_5c8._0_8_ = &local_5b8;
  local_638.m_fragment.m_context = local_638.m_compute.m_context;
  local_638.m_geometry.m_context = local_638.m_compute.m_context;
  local_638.m_tess_ctrl.m_context = local_638.m_compute.m_context;
  local_638.m_tess_eval.m_context = local_638.m_compute.m_context;
  local_638.m_vertex.m_context = local_638.m_compute.m_context;
  local_638.m_context = local_638.m_compute.m_context;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5c8,0x1b32ab9);
  local_670._0_8_ = (long)local_670 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_670,
             "#version 440 core\n\nin  float gs_fs_color;\nout vec4  fs_out_color;\n\nvoid main()\n{\n    fs_out_color = vec4(gs_fs_color, 0, 0, 1);\n}\n\n"
             ,"");
  local_720._M_dataplus._M_p = (pointer)&local_720.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_720,
             "#version 440 core\n\nlayout(points)                           in;\nlayout(triangle_strip, max_vertices = 4) out;\n\nstruct Rectangle {\n    vec2 position;\n    vec2 size;\n};\n\nlayout (std140, binding = 0) uniform Rectangles {\n    Rectangle rectangle[2];\n} rectangles;\n\nlayout (binding = 0) uniform atomic_uint atom_color;\n\nin  uint  vs_gs_index[];\nout float gs_fs_color;\n\nvoid main()\n{\n    const uint  atom_color_value = atomicCounterIncrement(atom_color);\n    //const uint  atom_color_value = vs_gs_index[0];\n    const float color            = float(atom_color_value) / 255.0;\n    //const float color            = rectangles.rectangle[1].size.x;\n\n    const float left   = rectangles.rectangle[vs_gs_index[0]].position.x;\n    const float bottom = rectangles.rectangle[vs_gs_index[0]].position.y;\n    const float right  = rectangles.rectangle[vs_gs_index[0]].size.x + left;\n    const float top    = rectangles.rectangle[vs_gs_index[0]].size.y + bottom;\n\n    //const float left   = rectangles.rectangle[0].position.x;\n    //const float bottom = rectangles.rectangle[0].position.y;\n    //const float right  = rectangles.rectangle[0].size.x + left;\n    //const float top    = rectangles.rectangle[0].size.y + bottom;\n\n    gs_fs_color = color;\n    gl_Position  = vec4(left, bottom, 0, 1);\n    EmitVertex();\n\n    gs_fs_color = color;\n    gl_Position  = vec4(left, top, 0, 1);\n    EmitVertex();\n\n    gs_fs_color = color;\n    gl_Position  = vec4(right, bottom, 0, 1);\n    EmitVertex();\n\n    gs_fs_color = color;\n    gl_Position  = vec4(right, top, 0, 1);\n    EmitVertex();\n}\n\n"
             ,"");
  local_740._M_dataplus._M_p = (pointer)&local_740.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_740,0x1b32ab9);
  local_6e8._M_dataplus._M_p = (pointer)&local_6e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6e8,0x1b32ab9);
  local_6c8._M_dataplus._M_p = (pointer)&local_6c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_6c8,
             "#version 440 core\n\nout uint vs_gs_index;\n\nvoid main()\n{\n    vs_gs_index = gl_VertexID;\n}\n\n"
             ,"");
  BufferStorage::Program::Init
            (&local_638,(string *)local_5c8,(string *)local_670,&local_720,&local_740,&local_6e8,
             &local_6c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6c8._M_dataplus._M_p != &local_6c8.field_2) {
    operator_delete(local_6c8._M_dataplus._M_p,local_6c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6e8._M_dataplus._M_p != &local_6e8.field_2) {
    operator_delete(local_6e8._M_dataplus._M_p,local_6e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_740._M_dataplus._M_p != &local_740.field_2) {
    operator_delete(local_740._M_dataplus._M_p,local_740.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_720._M_dataplus._M_p != &local_720.field_2) {
    operator_delete(local_720._M_dataplus._M_p,local_720.field_2._M_allocated_capacity + 1);
  }
  if (local_670._0_8_ != (long)local_670 + 0x10) {
    operator_delete((void *)local_670._0_8_,local_670._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5c8._0_8_ != &local_5b8) {
    operator_delete((void *)local_5c8._0_8_,local_5b8._M_allocated_capacity + 1);
  }
  (*gl->useProgram)(local_638.m_id);
  GVar6 = (*gl->getError)();
  glu::checkError(GVar6,"UseProgram",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                  ,0x460);
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar4 = glu::contextSupports(ctxType,(ApiType)0x154);
  iVar5 = (*(local_698.m_context)->m_renderCtx->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var_00,iVar5) + 0x40))(local_698.m_target,local_698.m_id);
  dVar7 = (**(code **)(CONCAT44(extraout_var_00,iVar5) + 0x800))();
  glu::checkError(dVar7,"BindBuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                  ,0x284);
  MVar11 = BufferStorage::Buffer::MapRange(&local_698,0,4,(uint)bVar4 * 0x10 + 0x43);
  local_6e8._M_string_length = (size_type)MVar11.buffer;
  local_6e8._M_dataplus._M_p = (pointer)MVar11.data;
  iVar5 = (*(local_700.m_context)->m_renderCtx->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var_01,iVar5) + 0x40))(local_700.m_target,local_700.m_id);
  dVar7 = (**(code **)(CONCAT44(extraout_var_01,iVar5) + 0x800))();
  glu::checkError(dVar7,"BindBuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                  ,0x284);
  MVar12 = BufferStorage::Buffer::MapRange(&local_700,0,0x20,(uint)bVar4 * 0x10 | 0x42);
  local_6c8._M_dataplus._M_p = (pointer)MVar12.data;
  local_6c8._M_string_length = (size_type)MVar12.buffer;
  (*gl->bindBuffer)(0x92c0,0);
  GVar6 = (*gl->getError)();
  glu::checkError(GVar6,"BindBuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                  ,0x284);
  (*gl->bindBuffer)(0x8a11,0);
  GVar6 = (*gl->getError)();
  glu::checkError(GVar6,"BindBuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                  ,0x284);
  (*gl->bindBufferBase)(0x92c0,0,local_698.m_id);
  GVar6 = (*gl->getError)();
  glu::checkError(GVar6,"BindBufferBase",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                  ,0x291);
  (*gl->bindBufferBase)(0x8a11,0,local_700.m_id);
  GVar6 = (*gl->getError)();
  glu::checkError(GVar6,"BindBufferBase",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                  ,0x291);
  (*gl->enable)(0xbe2);
  (*gl->blendFunc)(1,1);
  *(int *)MVar11.data = 1;
  local_6c8._M_dataplus._M_p[0] = '\0';
  local_6c8._M_dataplus._M_p[1] = '\0';
  local_6c8._M_dataplus._M_p[2] = '\0';
  local_6c8._M_dataplus._M_p[3] = -0x41;
  local_6c8._M_dataplus._M_p[4] = '\0';
  local_6c8._M_dataplus._M_p[5] = '\0';
  local_6c8._M_dataplus._M_p[6] = '\0';
  local_6c8._M_dataplus._M_p[7] = -0x41;
  *(undefined1 **)(local_6c8._M_dataplus._M_p + 8) = &DAT_3f8000003f800000;
  local_6c8._M_dataplus._M_p[0x10] = '\0';
  local_6c8._M_dataplus._M_p[0x11] = '\0';
  local_6c8._M_dataplus._M_p[0x12] = '@';
  local_6c8._M_dataplus._M_p[0x13] = -0x41;
  local_6c8._M_dataplus._M_p[0x14] = '\0';
  local_6c8._M_dataplus._M_p[0x15] = '\0';
  local_6c8._M_dataplus._M_p[0x16] = '@';
  local_6c8._M_dataplus._M_p[0x17] = -0x41;
  local_6c8._M_dataplus._M_p[0x18] = '\0';
  local_6c8._M_dataplus._M_p[0x19] = '\0';
  local_6c8._M_dataplus._M_p[0x1a] = -0x40;
  local_6c8._M_dataplus._M_p[0x1b] = '?';
  local_6c8._M_dataplus._M_p[0x1c] = '\0';
  local_6c8._M_dataplus._M_p[0x1d] = '\0';
  local_6c8._M_dataplus._M_p[0x1e] = -0x40;
  local_6c8._M_dataplus._M_p[0x1f] = '?';
  if (bVar4) {
    (*gl->flushMappedBufferRange)(0x92c0,0,4);
    GVar6 = (*gl->getError)();
    pcVar9 = "glFlushMappedBufferRange";
    glu::checkError(GVar6,"glFlushMappedBufferRange",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                    ,0xe01);
    (*gl->flushMappedBufferRange)(0x8a11,0,0x20);
    dVar7 = (*gl->getError)();
    iVar5 = 0xe04;
  }
  else {
    (*gl->memoryBarrier)(0x4000);
    dVar7 = (*gl->getError)();
    iVar5 = 0xe09;
    pcVar9 = "MemoryBarrier";
  }
  glu::checkError(dVar7,pcVar9,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                  ,iVar5);
  local_448[0] = 0;
  local_448[1] = 0;
  local_448[2] = 0;
  local_448[3] = 0;
  (*gl->clearBufferiv)(0x1800,0,local_448);
  (*gl->drawArrays)(0,0,2);
  GVar6 = (*gl->getError)();
  glu::checkError(GVar6,"DrawArrays with persistently mapped buffers",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                  ,0xe12);
  (*gl->memoryBarrier)(0xffffffff);
  GVar6 = (*gl->getError)();
  pcVar9 = "MemoryBarrier";
  glu::checkError(GVar6,"MemoryBarrier",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                  ,0xe16);
  (*gl->getTexImage)(0xde1,0,0x1908,0x1401,local_438);
  GVar6 = (*gl->getError)();
  glu::checkError(GVar6,"GetTexImage",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                  ,0x583);
  bVar10 = local_21c == -0xfffffd;
  if (!bVar10) {
    local_5c8._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_5c8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Contents of framebuffer does not correspond with expected results"
               ,0x41);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_5c8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_550);
    local_5c8._0_4_ = RGBA;
    local_5c8._4_4_ = UNORM_INT8;
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
              ((ConstPixelBufferAccess *)local_670,(TextureFormat *)local_5c8,0x10,0x10,1,local_438)
    ;
    pTVar2 = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    local_720._M_dataplus._M_p = (pointer)&local_720.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_720,"Framebuffer","");
    local_740._M_dataplus._M_p = (pointer)&local_740.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_740,"Framebuffer contents using initial buffer data","");
    pCVar8 = (ConstPixelBufferAccess *)local_670;
    tcu::LogImage::LogImage
              ((LogImage *)local_5c8,&local_720,&local_740,pCVar8,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)local_5c8,(int)pTVar2,__buf,(size_t)pCVar8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5a8._M_p != local_598) {
      operator_delete(local_5a8._M_p,local_598[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5c8._0_8_ != &local_5b8) {
      operator_delete((void *)local_5c8._0_8_,local_5b8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_740._M_dataplus._M_p != &local_740.field_2) {
      operator_delete(local_740._M_dataplus._M_p,local_740.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_720._M_dataplus._M_p != &local_720.field_2) {
      operator_delete(local_720._M_dataplus._M_p,local_720.field_2._M_allocated_capacity + 1);
    }
  }
  _Var3._M_p = local_6e8._M_dataplus._M_p;
  iVar5 = *(int *)local_6e8._M_dataplus._M_p;
  if (iVar5 != 3) {
    local_5c8._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_5c8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Contents of ATOMIC_COUNTER buffer are invalid.",0x2e);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_5c8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_550);
  }
  bVar10 = iVar5 == 3 && bVar10;
  _Var3._M_p[0] = '\x05';
  _Var3._M_p[1] = '\0';
  _Var3._M_p[2] = '\0';
  _Var3._M_p[3] = '\0';
  local_6c8._M_dataplus._M_p[0] = '\0';
  local_6c8._M_dataplus._M_p[1] = '\0';
  local_6c8._M_dataplus._M_p[2] = -0x80;
  local_6c8._M_dataplus._M_p[3] = -0x41;
  local_6c8._M_dataplus._M_p[4] = '\0';
  local_6c8._M_dataplus._M_p[5] = '\0';
  local_6c8._M_dataplus._M_p[6] = -0x80;
  local_6c8._M_dataplus._M_p[7] = -0x41;
  *(undefined1 **)(local_6c8._M_dataplus._M_p + 8) = &DAT_3f0000003f000000;
  *(undefined1 **)(local_6c8._M_dataplus._M_p + 0x10) = &DAT_3f0000003f000000;
  *(undefined1 **)(local_6c8._M_dataplus._M_p + 0x18) = &DAT_3f0000003f000000;
  if (bVar4) {
    (*gl->flushMappedBufferRange)(0x92c0,0,4);
    GVar6 = (*gl->getError)();
    pcVar9 = "glFlushMappedBufferRange";
    glu::checkError(GVar6,"glFlushMappedBufferRange",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                    ,0xe3a);
    (*gl->flushMappedBufferRange)(0x8a11,0,0x20);
    dVar7 = (*gl->getError)();
    iVar5 = 0xe3d;
  }
  else {
    (*gl->memoryBarrier)(0x4000);
    dVar7 = (*gl->getError)();
    iVar5 = 0xe42;
  }
  glu::checkError(dVar7,pcVar9,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                  ,iVar5);
  (*gl->drawArrays)(0,0,2);
  GVar6 = (*gl->getError)();
  glu::checkError(GVar6,"DrawArrays with persistently mapped buffers",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                  ,0xe47);
  (*gl->memoryBarrier)(0xffffffff);
  GVar6 = (*gl->getError)();
  glu::checkError(GVar6,"MemoryBarrier",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                  ,0xe4b);
  (*gl->getTexImage)(0xde1,0,0x1908,0x1401,local_438);
  GVar6 = (*gl->getError)();
  glu::checkError(GVar6,"GetTexImage",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                  ,0x583);
  if (local_21c != -0xfffffd) {
    local_5c8._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_5c8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Contents of framebuffer does not correspond with expected results"
               ,0x41);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_5c8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_550);
    local_5c8._0_4_ = RGBA;
    local_5c8._4_4_ = UNORM_INT8;
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
              ((ConstPixelBufferAccess *)local_670,(TextureFormat *)local_5c8,0x10,0x10,1,local_438)
    ;
    pTVar2 = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    local_720._M_dataplus._M_p = (pointer)&local_720.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_720,"Framebuffer","");
    local_740._M_dataplus._M_p = (pointer)&local_740.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_740,"Framebuffer contents using updated buffer data","");
    pCVar8 = (ConstPixelBufferAccess *)local_670;
    tcu::LogImage::LogImage
              ((LogImage *)local_5c8,&local_720,&local_740,pCVar8,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)local_5c8,(int)pTVar2,__buf_00,(size_t)pCVar8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5a8._M_p != local_598) {
      operator_delete(local_5a8._M_p,local_598[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5c8._0_8_ != &local_5b8) {
      operator_delete((void *)local_5c8._0_8_,local_5b8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_740._M_dataplus._M_p != &local_740.field_2) {
      operator_delete(local_740._M_dataplus._M_p,local_740.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_720._M_dataplus._M_p != &local_720.field_2) {
      operator_delete(local_720._M_dataplus._M_p,local_720.field_2._M_allocated_capacity + 1);
    }
    bVar10 = false;
  }
  if (*(int *)local_6e8._M_dataplus._M_p == 7) {
    BufferStorage::Buffer::MapOwner::~MapOwner((MapOwner *)&local_6c8);
    BufferStorage::Buffer::MapOwner::~MapOwner((MapOwner *)&local_6e8);
    if (bVar10) {
      pcVar9 = "Pass";
      testResult = QP_TEST_RESULT_PASS;
      goto LAB_00879b26;
    }
  }
  else {
    local_5c8._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_5c8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Contents of ATOMIC_COUNTER buffer are invalid.",0x2e);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_5c8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_550);
    BufferStorage::Buffer::MapOwner::~MapOwner((MapOwner *)&local_6c8);
    BufferStorage::Buffer::MapOwner::~MapOwner((MapOwner *)&local_6e8);
  }
  pcVar9 = "Fail";
  testResult = QP_TEST_RESULT_FAIL;
LAB_00879b26:
  tcu::TestContext::setTestResult(((this->super_TestCase).m_context)->m_testCtx,testResult,pcVar9);
  BufferStorage::Program::~Program(&local_638);
  VertexArray::Release(&local_648);
  BufferStorage::Texture::~Texture(&local_680);
  BufferStorage::Framebuffer::~Framebuffer(&local_6a8);
  BufferStorage::Buffer::~Buffer(&local_700);
  BufferStorage::Buffer::~Buffer(&local_698);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult MapPersistentDrawTest::iterate()
{
	/*
	 *   * fragment shader should pass value of "gs_fs_color" varying to red
	 *   channel of output color;
	 */
	static const GLchar* fragment_shader = "#version 440 core\n"
										   "\n"
										   "in  float gs_fs_color;\n"
										   "out vec4  fs_out_color;\n"
										   "\n"
										   "void main()\n"
										   "{\n"
										   "    fs_out_color = vec4(gs_fs_color, 0, 0, 1);\n"
										   "}\n"
										   "\n";

	/*
	 *   * geometry shader should:
	 *     - define single uniform buffer array "rectangles" with unspecified size;
	 *     Rectangles should have two vec2 fields: position and size;
	 *     - define single atomic_uint "atom_color";
	 *     - increment "atom_color" once per execution;
	 *     - output a quad that is placed at rectangles[vs_gs_index].position and
	 *     has size equal rectangles[vs_gs_index].size;
	 *     - define output float varying "gs_fs_color" equal to "atom_color" / 255;
	 */
	static const GLchar* geometry_shader =
		"#version 440 core\n"
		"\n"
		"layout(points)                           in;\n"
		"layout(triangle_strip, max_vertices = 4) out;\n"
		"\n"
		"struct Rectangle {\n"
		"    vec2 position;\n"
		"    vec2 size;\n"
		"};\n"
		"\n"
		"layout (std140, binding = 0) uniform Rectangles {\n"
		"    Rectangle rectangle[2];\n"
		"} rectangles;\n"
		"\n"
		"layout (binding = 0) uniform atomic_uint atom_color;\n"
		"\n"
		"in  uint  vs_gs_index[];\n"
		"out float gs_fs_color;\n"
		"\n"
		"void main()\n"
		"{\n"
		"    const uint  atom_color_value = atomicCounterIncrement(atom_color);\n"
		"    //const uint  atom_color_value = vs_gs_index[0];\n"
		"    const float color            = float(atom_color_value) / 255.0;\n"
		"    //const float color            = rectangles.rectangle[1].size.x;\n"
		"\n"
		"    const float left   = rectangles.rectangle[vs_gs_index[0]].position.x;\n"
		"    const float bottom = rectangles.rectangle[vs_gs_index[0]].position.y;\n"
		"    const float right  = rectangles.rectangle[vs_gs_index[0]].size.x + left;\n"
		"    const float top    = rectangles.rectangle[vs_gs_index[0]].size.y + bottom;\n"
		"\n"
		"    //const float left   = rectangles.rectangle[0].position.x;\n"
		"    //const float bottom = rectangles.rectangle[0].position.y;\n"
		"    //const float right  = rectangles.rectangle[0].size.x + left;\n"
		"    //const float top    = rectangles.rectangle[0].size.y + bottom;\n"
		"\n"
		"    gs_fs_color = color;\n"
		"    gl_Position  = vec4(left, bottom, 0, 1);\n"
		"    EmitVertex();\n"
		"\n"
		"    gs_fs_color = color;\n"
		"    gl_Position  = vec4(left, top, 0, 1);\n"
		"    EmitVertex();\n"
		"\n"
		"    gs_fs_color = color;\n"
		"    gl_Position  = vec4(right, bottom, 0, 1);\n"
		"    EmitVertex();\n"
		"\n"
		"    gs_fs_color = color;\n"
		"    gl_Position  = vec4(right, top, 0, 1);\n"
		"    EmitVertex();\n"
		"}\n"
		"\n";

	/*
	 *   * vertex shader should output single varying "vs_gs_index" of type uint,
	 *   equal to gl_VertexID;
	 */
	static const GLchar* vertex_shader = "#version 440 core\n"
										 "\n"
										 "out uint vs_gs_index;\n"
										 "\n"
										 "void main()\n"
										 "{\n"
										 "    vs_gs_index = gl_VertexID;\n"
										 "}\n"
										 "\n";

	static const GLuint atom_binding		 = 0;
	static const size_t atom_data_size		 = 1 * sizeof(GLuint);
	static const GLuint expected_atom_first  = 3;
	static const GLuint expected_atom_second = 7;
	static const GLuint expected_pixel		 = 0xff000003;
	static const GLuint height				 = 16;
	static const GLuint n_rectangles		 = 2;
	static const GLuint pixel_size			 = 4 * sizeof(GLubyte);
	static const GLuint rectangles_binding   = 0;
	static const size_t rectangle_size		 = 2 * 2 * sizeof(GLfloat); /* 2 * vec2 */
	static const size_t rectangles_data_size = n_rectangles * rectangle_size;
	static const GLuint width				 = 16;
	static const GLuint line_size			 = width * pixel_size;
	static const GLuint pixel_offset		 = 8 * line_size + 7 * pixel_size;
	static const size_t texture_data_size	= height * line_size;

	const Functions& gl = m_context.getRenderContext().getFunctions();

	bool test_result = true;

	/* Prepare data */
	GLuint  atom_first_data[1];
	GLuint  atom_second_data[1];
	GLubyte rectangles_first_data[rectangles_data_size];
	GLubyte rectangles_second_data[rectangles_data_size];
	GLubyte texture_data[texture_data_size];

	atom_first_data[0]  = 1;
	atom_second_data[0] = 5;

	{
		GLfloat* ptr = (GLfloat*)rectangles_first_data;

		/* First.position*/
		ptr[0] = -0.5f;
		ptr[1] = -0.5f;

		/* First.size*/
		ptr[2] = 1.0f;
		ptr[3] = 1.0f;

		/* Second.position*/
		ptr[4 + 0] = -0.75f;
		ptr[4 + 1] = -0.75f;

		/* Second.size*/
		ptr[4 + 2] = 1.5f;
		ptr[4 + 3] = 1.5f;
	}

	{
		GLfloat* ptr = (GLfloat*)rectangles_second_data;

		/* First.position*/
		ptr[0] = -1.0f;
		ptr[1] = -1.0f;

		/* First.size*/
		ptr[2] = 0.5f;
		ptr[3] = 0.5f;

		/* Second.position*/
		ptr[4 + 0] = 0.5f;
		ptr[4 + 1] = 0.5f;

		/* Second.size*/
		ptr[4 + 2] = 0.5f;
		ptr[4 + 3] = 0.5f;
	}

	/* Prepare buffers */
	Buffer atom(m_context);
	Buffer rectangles(m_context);

	atom.InitStorage(GL_ATOMIC_COUNTER_BUFFER, GL_MAP_PERSISTENT_BIT | GL_MAP_READ_BIT | GL_MAP_WRITE_BIT,
					 atom_data_size, 0);

	rectangles.InitStorage(GL_UNIFORM_BUFFER, GL_MAP_PERSISTENT_BIT | GL_MAP_WRITE_BIT, rectangles_data_size, 0);

	/* Prepare framebuffer */
	Framebuffer framebuffer(m_context);
	Texture		texture(m_context);

	Texture::Generate(gl, texture.m_id);
	Texture::Bind(gl, texture.m_id, GL_TEXTURE_2D);
	Texture::Storage(gl, GL_TEXTURE_2D, 1 /* levels */, GL_RGBA8, width, height, 0 /* depth */);

	Framebuffer::Generate(gl, framebuffer.m_id);
	Framebuffer::Bind(gl, GL_DRAW_FRAMEBUFFER, framebuffer.m_id);
	Framebuffer::AttachTexture(gl, GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, texture.m_id, width, height);

	/* Prepare VAO */
	VertexArray vao(m_context);

	VertexArray::Generate(gl, vao.m_id);
	VertexArray::Bind(gl, vao.m_id);

	/* Prepare program */
	Program program(m_context);
	program.Init("" /* cs */, fragment_shader, geometry_shader, "" /* tcs */, "" /* tes */, vertex_shader);
	Program::Use(gl, program.m_id);

	/*
	 * - make persistent mapping of both buffers for reads and writes;
	 * - modify "rectangles" buffer via mapped memory with the following two sets
	 *   * position [-0.5,-0.5], size [1.0,1.0],
	 *   * position [-0.25,-0.25], size [1.5,1.5];
	 * - modify "atom_color" buffer via mapped memory to value 1;
	 * - execute MemoryBarrier for CLIENT_MAPPED_BUFFER_BARRIER_BIT;
	 * - enable blending with functions ONE for both source and destination;
	 * - execute DrawArrays for two vertices;
	 * - execute MemoryBarrier for ALL_BARRIER_BITS and Finish;
	 * - inspect contents of:
	 *   * texture - to verify that pixel at 8,8 is filled with RGBA8(3,0,0,0),
	 *   * "atom_color" - to verify that it is equal to 3;
	 * - modify "rectangles" buffer via mapped memory with the following two sets
	 *   * position [-1.0,-1.0], size [0.5,0.5],
	 *   * position [0.5,0.5], size [0.5,0.5];
	 * - modify "atom_color" buffer via mapped memory to value 5;
	 * - execute MemoryBarrier for CLIENT_MAPPED_BUFFER_BARRIER_BIT;
	 * - execute DrawArrays for two vertices;
	 * - execute MemoryBarrier for ALL_BARRIER_BITS and Finish;
	 * - inspect contents of:
	 *   * texture - to verify that pixel at 8,8 is filled with RGBA8(3,0,0,0),
	 *   * "atom_color" - to verify that it is equal to 7;
	 *
	 *  Additionally: change MemoryBarrier to FlushMapped*BufferRange if context supports OpenGL 4.5 Core Profile.
	 */
	{
		/* Choose specification */
		const bool is_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));

		/* Map buffers */
		atom.Bind();
		const Buffer::MapOwner atom_map(atom.MapRange(0 /* offset */, atom_data_size,
													  GL_MAP_PERSISTENT_BIT | GL_MAP_READ_BIT | GL_MAP_WRITE_BIT |
														  (is_gl_45 ? GL_MAP_FLUSH_EXPLICIT_BIT : 0)));

		rectangles.Bind();
		const Buffer::MapOwner rectangles_map(
			rectangles.MapRange(0 /* offset */, rectangles_data_size,
								GL_MAP_PERSISTENT_BIT | GL_MAP_WRITE_BIT | (is_gl_45 ? GL_MAP_FLUSH_EXPLICIT_BIT : 0)));

		/* Clear binding points */
		Buffer::Bind(gl, 0, GL_ATOMIC_COUNTER_BUFFER);
		Buffer::Bind(gl, 0, GL_UNIFORM_BUFFER);

		/* Bind buffers */
		Buffer::BindBase(gl, atom.m_id, GL_ATOMIC_COUNTER_BUFFER, atom_binding);
		Buffer::BindBase(gl, rectangles.m_id, GL_UNIFORM_BUFFER, rectangles_binding);

		/* Set up blending */
		gl.enable(GL_BLEND);
		gl.blendFunc(GL_ONE, GL_ONE);

		/* Modify buffers */
		memcpy(atom_map.m_data, atom_first_data, atom_data_size);
		memcpy(rectangles_map.m_data, rectangles_first_data, rectangles_data_size);

		/* Execute barrier or flush content. */
		if (is_gl_45)
		{
			gl.flushMappedBufferRange(GL_ATOMIC_COUNTER_BUFFER, 0, atom_data_size);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glFlushMappedBufferRange");

			gl.flushMappedBufferRange(GL_UNIFORM_BUFFER, 0, rectangles_data_size);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glFlushMappedBufferRange");
		}
		else
		{
			gl.memoryBarrier(GL_CLIENT_MAPPED_BUFFER_BARRIER_BIT);
			GLU_EXPECT_NO_ERROR(gl.getError(), "MemoryBarrier");
		}

		/* Clear drawbuffer */
		GLint clear_color[4] = { 0, 0, 0, 0 };
		gl.clearBufferiv(GL_COLOR, 0, clear_color);

		/* Execute program for 2 vertices */
		gl.drawArrays(GL_POINTS, 0, 2);
		GLU_EXPECT_NO_ERROR(gl.getError(), "DrawArrays with persistently mapped buffers");

		/* Execute barrier */
		gl.memoryBarrier(GL_ALL_BARRIER_BITS);
		GLU_EXPECT_NO_ERROR(gl.getError(), "MemoryBarrier");

		/* Inspect texture */
		Texture::GetData(gl, GL_TEXTURE_2D, GL_RGBA, GL_UNSIGNED_BYTE, texture_data);
		if (0 != memcmp(texture_data + pixel_offset, &expected_pixel, pixel_size))
		{
			test_result = false;

			m_context.getTestContext().getLog() << tcu::TestLog::Message
												<< "Contents of framebuffer does not correspond with expected results"
												<< tcu::TestLog::EndMessage;
			tcu::ConstPixelBufferAccess img(
				tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8), width, height,
				1 /* depth */, texture_data);
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Image("Framebuffer", "Framebuffer contents using initial buffer data", img);
		}

		/* Inspect atom */
		if (0 != memcmp(atom_map.m_data, &expected_atom_first, sizeof(GLuint)))
		{
			test_result = false;

			m_context.getTestContext().getLog() << tcu::TestLog::Message
												<< "Contents of ATOMIC_COUNTER buffer are invalid."
												<< tcu::TestLog::EndMessage;
		}

		/* Modify buffers */
		memcpy(atom_map.m_data, atom_second_data, atom_data_size);
		memcpy(rectangles_map.m_data, rectangles_second_data, rectangles_data_size);

		/* Execute barrier or flush content. */
		if (is_gl_45)
		{
			gl.flushMappedBufferRange(GL_ATOMIC_COUNTER_BUFFER, 0, atom_data_size);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glFlushMappedBufferRange");

			gl.flushMappedBufferRange(GL_UNIFORM_BUFFER, 0, rectangles_data_size);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glFlushMappedBufferRange");
		}
		else
		{
			gl.memoryBarrier(GL_CLIENT_MAPPED_BUFFER_BARRIER_BIT);
			GLU_EXPECT_NO_ERROR(gl.getError(), "MemoryBarrier");
		}

		/* Execute program for 2 vertices */
		gl.drawArrays(GL_POINTS, 0, 2);
		GLU_EXPECT_NO_ERROR(gl.getError(), "DrawArrays with persistently mapped buffers");

		/* Execute barrier */
		gl.memoryBarrier(GL_ALL_BARRIER_BITS);
		GLU_EXPECT_NO_ERROR(gl.getError(), "MemoryBarrier");

		/* Inspect texture */
		Texture::GetData(gl, GL_TEXTURE_2D, GL_RGBA, GL_UNSIGNED_BYTE, texture_data);
		if (0 != memcmp(texture_data + pixel_offset, &expected_pixel, pixel_size))
		{
			test_result = false;

			m_context.getTestContext().getLog() << tcu::TestLog::Message
												<< "Contents of framebuffer does not correspond with expected results"
												<< tcu::TestLog::EndMessage;
			tcu::ConstPixelBufferAccess img(
				tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8), width, height,
				1 /* depth */, texture_data);
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Image("Framebuffer", "Framebuffer contents using updated buffer data", img);
		}

		/* Inspect atom */
		if (0 != memcmp(atom_map.m_data, &expected_atom_second, sizeof(GLuint)))
		{
			test_result = false;

			m_context.getTestContext().getLog() << tcu::TestLog::Message
												<< "Contents of ATOMIC_COUNTER buffer are invalid."
												<< tcu::TestLog::EndMessage;
		}
	}

	/* Set result */
	if (true == test_result)
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	/* Done */
	return tcu::TestNode::STOP;
}